

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

char * convertLatin1toUTF8(char *source)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *in_RDI;
  char *tp;
  char *target;
  char *sp;
  size_t size;
  char *local_28;
  char *local_18;
  size_t local_10;
  
  local_10 = 1;
  for (local_18 = in_RDI; *local_18 != '\0'; local_18 = local_18 + 1) {
    iVar1 = 1;
    if (((int)*local_18 & 0x80U) != 0) {
      iVar1 = 2;
    }
    local_10 = (long)iVar1 + local_10;
  }
  pcVar2 = (char *)calloc(local_10,1);
  local_28 = pcVar2;
  for (local_18 = in_RDI; *local_18 != '\0'; local_18 = local_18 + 1) {
    sVar3 = encodeUTF8(local_28,(int)*local_18);
    local_28 = local_28 + sVar3;
  }
  return pcVar2;
}

Assistant:

static char* convertLatin1toUTF8(const char* source)
{
    size_t size = 1;
    const char* sp;

    for (sp = source;  *sp;  sp++)
        size += (*sp & 0x80) ? 2 : 1;

    char* target = calloc(size, 1);
    char* tp = target;

    for (sp = source;  *sp;  sp++)
        tp += encodeUTF8(tp, *sp);

    return target;
}